

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-cave.c
# Opt level: O3

void do_cmd_go_up(command *cmd)

{
  loc grid;
  player_upkeep *ppVar1;
  player *p;
  _Bool _Var2;
  wchar_t dlev;
  command *cmd_00;
  char *fmt;
  
  grid.x = (player->grid).x;
  grid.y = (player->grid).y;
  cmd_00 = (command *)cave;
  _Var2 = square_isupstairs(cave,grid);
  if (!_Var2) {
    do_cmd_navigate_up(cmd_00);
    return;
  }
  if ((player->opts).opt[0x20] == true) {
    fmt = "Nothing happens!";
  }
  else {
    dlev = dungeon_get_next_level(player,(int)player->depth,L'\xffffffff');
    if (dlev != player->depth) {
      player->upkeep->energy_use = (uint)z_info->move_energy;
      msgt(0x4e,"You enter a maze of up staircases.");
      p = player;
      ppVar1 = player->upkeep;
      ppVar1->create_up_stair = false;
      ppVar1->create_down_stair = true;
      dungeon_change_level(p,dlev);
      return;
    }
    fmt = "You can\'t go up from here!";
  }
  msg(fmt);
  return;
}

Assistant:

void do_cmd_go_up(struct command *cmd)
{
	int ascend_to;

	/* Verify stairs */
	if (!square_isupstairs(cave, player->grid)) {
		do_cmd_navigate_up(cmd);
		return;
	}

	/* Force descend */
	if (OPT(player, birth_force_descend)) {
		msg("Nothing happens!");
		return;
	}
	
	ascend_to = dungeon_get_next_level(player, player->depth, -1);
	
	if (ascend_to == player->depth) {
		msg("You can't go up from here!");
		return;
	}

	/* Take a turn */
	player->upkeep->energy_use = z_info->move_energy;

	/* Success */
	msgt(MSG_STAIRS_UP, "You enter a maze of up staircases.");

	/* Create a way back */
	player->upkeep->create_up_stair = false;
	player->upkeep->create_down_stair = true;
	
	/* Change level */
	dungeon_change_level(player, ascend_to);
}